

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_fast_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int originalSize)

{
  byte bVar1;
  U16 UVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  size_t sVar5;
  BYTE *__n;
  BYTE *__src;
  BYTE *pBVar6;
  int local_dc;
  int result;
  LZ4_streamDecode_t_internal *lz4sd;
  int originalSize_local;
  char *dest_local;
  char *source_local;
  LZ4_streamDecode_t *LZ4_streamDecode_local;
  ulong local_a8;
  size_t u;
  size_t extml;
  BYTE *extMatch;
  BYTE *dictEnd;
  BYTE *match;
  size_t offset;
  size_t ml;
  size_t ll;
  uint token;
  BYTE *prefixStart;
  BYTE *oend;
  BYTE *op;
  BYTE *ip;
  LZ4_byte *local_38;
  size_t local_30;
  int local_24;
  char *local_20;
  char *local_18;
  int local_c;
  
  if ((LZ4_streamDecode->internal_donotuse).prefixSize == 0) {
    local_dc = LZ4_decompress_fast(source,dest,originalSize);
    if (local_dc < 1) {
      return local_dc;
    }
    *(long *)(LZ4_streamDecode->minStateSize + 0x18) = (long)originalSize;
    (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + originalSize);
  }
  else if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (LZ4_byte *)dest) {
    local_30 = (LZ4_streamDecode->internal_donotuse).prefixSize;
    local_38 = (LZ4_streamDecode->internal_donotuse).externalDict;
    ip = (BYTE *)(LZ4_streamDecode->internal_donotuse).extDictSize;
    pBVar3 = (BYTE *)(dest + originalSize);
    pBVar4 = (BYTE *)(dest + -local_30);
    oend = (BYTE *)dest;
    op = (BYTE *)source;
    local_24 = originalSize;
    local_20 = dest;
    local_18 = source;
    do {
      pBVar6 = op + 1;
      bVar1 = *op;
      ml = (size_t)(bVar1 >> 4);
      op = pBVar6;
      if (ml == 0xf) {
        sVar5 = read_long_length_no_check(&op);
        ml = sVar5 + 0xf;
      }
      if ((ulong)((long)pBVar3 - (long)oend) < ml) {
        local_c = -1;
        goto LAB_0014e6c4;
      }
      memmove(oend,op,ml);
      oend = oend + ml;
      op = op + ml;
      if ((ulong)((long)pBVar3 - (long)oend) < 0xc) {
        if (oend == pBVar3) {
          local_c = (int)op - (int)local_18;
        }
        else {
          local_c = -1;
        }
        goto LAB_0014e6c4;
      }
      offset = (size_t)(bVar1 & 0xf);
      UVar2 = LZ4_readLE16(op);
      pBVar6 = (BYTE *)(ulong)UVar2;
      op = op + 2;
      if (offset == 0xf) {
        sVar5 = read_long_length_no_check(&op);
        offset = sVar5 + 0xf;
      }
      __n = (BYTE *)(offset + 4);
      if (pBVar3 + -(long)oend < __n) {
        local_c = -1;
        goto LAB_0014e6c4;
      }
      if (ip + ((long)oend - (long)pBVar4) < pBVar6) {
        local_c = -1;
        goto LAB_0014e6c4;
      }
      dictEnd = oend + -(long)pBVar6;
      offset = (size_t)__n;
      if (oend + -(long)pBVar4 < pBVar6) {
        __src = ip + ((long)local_38 - ((long)pBVar6 - ((long)oend - (long)pBVar4)));
        pBVar6 = ip + ((long)local_38 - (long)__src);
        if (__n < pBVar6) {
          memmove(oend,__src,(size_t)__n);
          offset = 0;
          pBVar6 = __n;
        }
        else {
          memmove(oend,__src,(size_t)pBVar6);
          offset = (long)__n - (long)pBVar6;
        }
        oend = oend + (long)pBVar6;
        dictEnd = pBVar4;
      }
      for (local_a8 = 0; local_a8 < offset; local_a8 = local_a8 + 1) {
        oend[local_a8] = dictEnd[local_a8];
      }
      oend = oend + offset;
    } while (4 < (ulong)((long)pBVar3 - (long)oend));
    local_c = -1;
LAB_0014e6c4:
    local_dc = local_c;
    if (local_c < 1) {
      return local_c;
    }
    (LZ4_streamDecode->internal_donotuse).prefixSize =
         (long)originalSize + (LZ4_streamDecode->internal_donotuse).prefixSize;
    (LZ4_streamDecode->internal_donotuse).prefixEnd =
         (LZ4_streamDecode->internal_donotuse).prefixEnd + originalSize;
  }
  else {
    (LZ4_streamDecode->internal_donotuse).extDictSize =
         (LZ4_streamDecode->internal_donotuse).prefixSize;
    (LZ4_streamDecode->internal_donotuse).externalDict =
         (LZ4_streamDecode->internal_donotuse).prefixEnd +
         -(LZ4_streamDecode->internal_donotuse).extDictSize;
    local_dc = LZ4_decompress_fast_extDict
                         (source,dest,originalSize,
                          (LZ4_streamDecode->internal_donotuse).externalDict,
                          (LZ4_streamDecode->internal_donotuse).extDictSize);
    if (local_dc < 1) {
      return local_dc;
    }
    *(long *)(LZ4_streamDecode->minStateSize + 0x18) = (long)originalSize;
    (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + originalSize);
  }
  return local_dc;
}

Assistant:

LZ4_FORCE_O2 int
LZ4_decompress_fast_continue (LZ4_streamDecode_t* LZ4_streamDecode,
                        const char* source, char* dest, int originalSize)
{
    LZ4_streamDecode_t_internal* const lz4sd =
        (assert(LZ4_streamDecode!=NULL), &LZ4_streamDecode->internal_donotuse);
    int result;

    DEBUGLOG(5, "LZ4_decompress_fast_continue (toDecodeSize=%i)", originalSize);
    assert(originalSize >= 0);

    if (lz4sd->prefixSize == 0) {
        DEBUGLOG(5, "first invocation : no prefix nor extDict");
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_fast(source, dest, originalSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd = (BYTE*)dest + originalSize;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        DEBUGLOG(5, "continue using existing prefix");
        result = LZ4_decompress_unsafe_generic(
                        (const BYTE*)source, (BYTE*)dest, originalSize,
                        lz4sd->prefixSize,
                        lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)originalSize;
        lz4sd->prefixEnd  += originalSize;
    } else {
        DEBUGLOG(5, "prefix becomes extDict");
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_fast_extDict(source, dest, originalSize,
                                             lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd  = (BYTE*)dest + originalSize;
    }

    return result;
}